

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  v128 *this_00;
  Enum EVar1;
  long lVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  unsigned_long uVar6;
  ExpectedNan EVar7;
  ulong uVar8;
  char *pcVar9;
  undefined8 uVar10;
  Const *this_01;
  Stream *pSVar11;
  ulong uVar12;
  pointer pCVar13;
  ulong uVar14;
  Type local_44;
  long local_40;
  ConstVector *local_38;
  
  Stream::Writef(this->json_stream_,"[");
  pCVar13 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar13) {
    local_40 = 0;
    uVar14 = 0;
    local_38 = consts;
    do {
      this_01 = pCVar13 + uVar14;
      Stream::Writef(this->json_stream_,"{");
      Stream::Writef(this->json_stream_,"\"%s\": ","type");
      EVar1 = (this_01->type_).enum_;
      switch(EVar1) {
      case Any:
      case ~I64:
switchD_0015389a_caseD_0:
        abort();
      case Hostref:
        pSVar11 = this->json_stream_;
        pcVar9 = "hostref";
LAB_00153bbe:
        Stream::Writef(pSVar11,"\"%s\"",pcVar9);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        uVar10 = *(undefined8 *)(this_01->data_).v;
        pSVar11 = this->json_stream_;
LAB_00153c4c:
        Stream::Writef(pSVar11,"\"%lu\"",uVar10);
        break;
      case V128:
        Stream::Writef(this->json_stream_,"\"%s\"","v128");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","lane_type");
        if ((this_01->type_).enum_ != V128) {
LAB_00153d95:
          __assert_fail("type_ == Type::V128",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h"
                        ,0x60,"Type wabt::Const::lane_type() const");
        }
        local_44.enum_ = (this_01->lane_type_).enum_;
        pcVar9 = Type::GetName(&local_44);
        Stream::Writef(this->json_stream_,"\"%s\"",pcVar9);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"[");
        iVar4 = Const::lane_count(this_01);
        lVar2 = local_40;
        if (0 < iVar4) {
          this_00 = &this_01->data_;
          uVar12 = 0;
          do {
            if ((this_01->type_).enum_ != V128) goto LAB_00153d95;
            iVar4 = (int)uVar12;
            switch((this_01->lane_type_).enum_) {
            case I16:
              pSVar11 = this->json_stream_;
              uVar3 = v128::To<unsigned_short>(this_00,iVar4);
              uVar8 = (ulong)uVar3;
              goto LAB_00153a12;
            case I8:
              if (0xf < uVar12) {
                __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/common.h"
                              ,0x8d,"T v128::To(int) const [T = unsigned char]");
              }
              pSVar11 = this->json_stream_;
              uVar8 = (ulong)(pCVar13->data_).v[uVar12 + lVar2];
              goto LAB_00153a12;
            default:
              goto switchD_0015389a_caseD_0;
            case F64:
              uVar6 = v128::To<unsigned_long>(this_00,iVar4);
              EVar7 = None;
              if (uVar12 < 4) {
                EVar7 = *(ExpectedNan *)((long)pCVar13->nan_ + uVar12 * 4 + lVar2);
              }
              WriteF64(this,uVar6,EVar7);
              break;
            case F32:
              uVar5 = v128::To<unsigned_int>(this_00,iVar4);
              EVar7 = None;
              if (uVar12 < 4) {
                EVar7 = *(ExpectedNan *)((long)pCVar13->nan_ + uVar12 * 4 + lVar2);
              }
              WriteF32(this,uVar5,EVar7);
              break;
            case I64:
              pSVar11 = this->json_stream_;
              uVar6 = v128::To<unsigned_long>(this_00,iVar4);
              Stream::Writef(pSVar11,"\"%lu\"",uVar6);
              break;
            case I32:
              pSVar11 = this->json_stream_;
              uVar5 = v128::To<unsigned_int>(this_00,iVar4);
              uVar8 = (ulong)uVar5;
LAB_00153a12:
              Stream::Writef(pSVar11,"\"%u\"",uVar8);
            }
            iVar4 = Const::lane_count(this_01);
            if (uVar12 != iVar4 - 1) {
              Stream::Writef(this->json_stream_,", ");
            }
            uVar12 = uVar12 + 1;
            iVar4 = Const::lane_count(this_01);
          } while ((long)uVar12 < (long)iVar4);
        }
        Stream::Writef(this->json_stream_,"]");
        consts = local_38;
        break;
      case F64:
        Stream::Writef(this->json_stream_,"\"%s\"","f64");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteF64(this,*(uint64_t *)(this_01->data_).v,this_01->nan_[0]);
        break;
      case F32:
        Stream::Writef(this->json_stream_,"\"%s\"","f32");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteF32(this,*(uint32_t *)(this_01->data_).v,this_01->nan_[0]);
        break;
      case I64:
        Stream::Writef(this->json_stream_,"\"%s\"","i64");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        pSVar11 = this->json_stream_;
        uVar10 = *(undefined8 *)(this_01->data_).v;
        goto LAB_00153c4c;
      case I32:
        Stream::Writef(this->json_stream_,"\"%s\"","i32");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"%u\"",(ulong)*(uint *)(this_01->data_).v);
        break;
      default:
        if (EVar1 != Nullref) {
          if (EVar1 != Funcref) goto switchD_0015389a_caseD_0;
          pSVar11 = this->json_stream_;
          pcVar9 = "funcref";
          goto LAB_00153bbe;
        }
        Stream::Writef(this->json_stream_,"\"%s\"","nullref");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"0\"");
      }
      Stream::Writef(this->json_stream_,"}");
      if (uVar14 != ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 - 1U
         ) {
        Stream::Writef(this->json_stream_,", ");
      }
      uVar14 = uVar14 + 1;
      pCVar13 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_40 = local_40 + 0x48;
    } while (uVar14 < (ulong)(((long)(consts->
                                     super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pCVar13 >> 3)
                             * -0x71c71c71c71c71c7));
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}